

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O3

StatusCode __thiscall HttpConn::parseRequesetLine(HttpConn *this,int end_idx)

{
  pointer pcVar1;
  size_type *psVar2;
  int iVar3;
  Method MVar4;
  uint uVar5;
  int iVar6;
  StatusCode SVar7;
  size_type *local_50;
  string requestLine;
  
  pcVar1 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = &requestLine._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + end_idx);
  psVar2 = local_50;
  iVar3 = std::__cxx11::string::find((char *)&local_50,0x121ae6,0);
  if (iVar3 < 0) {
    iVar3 = std::__cxx11::string::find((char *)&local_50,0x121aea,0);
    iVar6 = 5;
    MVar4 = Head;
    if (iVar3 < 0) {
      iVar3 = std::__cxx11::string::find((char *)&local_50,0x121aef,0);
      SVar7 = BadRequest;
      MVar4 = Post;
      if (iVar3 < 0) goto LAB_00118093;
    }
  }
  else {
    iVar6 = 4;
    MVar4 = Get;
  }
  this->method_ = MVar4;
  this->checked_idx_ = iVar6 + this->checked_idx_;
  iVar3 = std::__cxx11::string::find((char)&local_50,0x20);
  SVar7 = BadRequest;
  if (-1 < iVar3) {
    std::__cxx11::string::replace
              ((ulong)&this->path_,0,(char *)(this->path_)._M_string_length,
               (ulong)((long)psVar2 + (long)this->checked_idx_));
    uVar5 = iVar3 + 1;
    this->checked_idx_ = uVar5;
    if ((long)requestLine._M_dataplus._M_p - (ulong)uVar5 == 8) {
      std::__cxx11::string::find((char *)&local_50,0x121af4,(ulong)uVar5);
      if ((((undefined1 *)((long)local_50 + -1))[(long)requestLine._M_dataplus._M_p] & 0xfe) == 0x30
         ) {
        this->version_ = Http11;
        this->checked_idx_ = (int)requestLine._M_dataplus._M_p + 2;
        SVar7 = OK;
      }
    }
  }
LAB_00118093:
  if (local_50 != &requestLine._M_string_length) {
    operator_delete(local_50);
  }
  return SVar7;
}

Assistant:

HttpConn::StatusCode HttpConn::parseRequesetLine(int end_idx) {
    std::string requestLine(readBuff_.data(), readBuff_.data() + end_idx);
    auto beg = requestLine.begin();
    int pos;
    do {
        pos = requestLine.find("GET");
        if (pos >= 0) {
            method_ = Get;
            checked_idx_ += 4;
            break;
        }
        pos = requestLine.find("HEAD");
        if (pos >= 0) {
            method_ = Head;
            checked_idx_ += 5;
            break;
        }
        pos = requestLine.find("POST");
        if (pos >= 0) {
            method_ = Post;
            checked_idx_ += 5;
            break;
        }
        //加入其他方法
        return BadRequest;
    } while (false);
    
    pos = requestLine.find(' ', checked_idx_);
    if (pos < 0) {
        return BadRequest;
    } else {
        path_.assign(beg + checked_idx_, beg + pos);
        checked_idx_ = pos + 1;
    }
   
    if ((requestLine.size() - checked_idx_) != 8 || requestLine.find("HTTP/1.", checked_idx_) < 0) {
        return BadRequest;
    } else if (requestLine.back() == '1') {
        version_ = Http11;
    } else if (requestLine.back() == '0') {
        version_ = Http11;
    } else 
        return BadRequest;
    
    checked_idx_ = requestLine.size() + 2;
    return OK;
}